

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int CompressFile(Context *context,BrotliEncoderState *s)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  BrotliEncoderOperation op;
  bool bVar3;
  int is_eof;
  BrotliEncoderState *s_local;
  Context *context_local;
  
  bVar3 = false;
  InitializeBuffers(context);
  while( true ) {
    if ((context->available_in == 0) && (!bVar3)) {
      iVar1 = ProvideInput(context);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = HasMoreInput(context);
      bVar3 = iVar1 == 0;
    }
    op = BROTLI_OPERATION_PROCESS;
    if (bVar3) {
      op = BROTLI_OPERATION_FINISH;
    }
    iVar1 = BrotliEncoderCompressStream
                      (s,op,&context->available_in,&context->next_in,&context->available_out,
                       &context->next_out,(size_t *)0x0);
    __stream = _stderr;
    if (iVar1 == 0) break;
    if ((context->available_out == 0) && (iVar1 = ProvideOutput(context), iVar1 == 0)) {
      return 0;
    }
    iVar1 = BrotliEncoderIsFinished(s);
    if (iVar1 != 0) {
      iVar1 = FlushOutput(context);
      if (iVar1 == 0) {
        context_local._4_4_ = 0;
      }
      else {
        if (0 < context->verbosity) {
          fprintf(_stderr,"Compressed ");
          PrintFileProcessingProgress(context);
          fprintf(_stderr,"\n");
        }
        context_local._4_4_ = 1;
      }
      return context_local._4_4_;
    }
  }
  pcVar2 = PrintablePath(context->current_input_path);
  fprintf(__stream,"failed to compress data [%s]\n",pcVar2);
  return 0;
}

Assistant:

static BROTLI_BOOL CompressFile(Context* context, BrotliEncoderState* s) {
  BROTLI_BOOL is_eof = BROTLI_FALSE;
  InitializeBuffers(context);
  for (;;) {
    if (context->available_in == 0 && !is_eof) {
      if (!ProvideInput(context)) return BROTLI_FALSE;
      is_eof = !HasMoreInput(context);
    }

    if (!BrotliEncoderCompressStream(s,
        is_eof ? BROTLI_OPERATION_FINISH : BROTLI_OPERATION_PROCESS,
        &context->available_in, &context->next_in,
        &context->available_out, &context->next_out, NULL)) {
      /* Should detect OOM? */
      fprintf(stderr, "failed to compress data [%s]\n",
              PrintablePath(context->current_input_path));
      return BROTLI_FALSE;
    }

    if (context->available_out == 0) {
      if (!ProvideOutput(context)) return BROTLI_FALSE;
    }

    if (BrotliEncoderIsFinished(s)) {
      if (!FlushOutput(context)) return BROTLI_FALSE;
      if (context->verbosity > 0) {
        fprintf(stderr, "Compressed ");
        PrintFileProcessingProgress(context);
        fprintf(stderr, "\n");
      }
      return BROTLI_TRUE;
    }
  }
}